

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proof.cc
# Opt level: O0

void __thiscall
gss::innards::Proof::create_null_decision_bound(Proof *this,int p,int t,optional<int> d)

{
  bool bVar1;
  key_type *__k;
  int *piVar2;
  pointer pIVar3;
  ostream *poVar4;
  mapped_type *pmVar5;
  long lVar6;
  int in_ESI;
  map<std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_RDI;
  int v_2;
  int v_1;
  int v;
  key_type *in_stack_ffffffffffffff78;
  pair<int,_int> local_78;
  pair<long,_long> local_70;
  int local_5c;
  pair<int,_int> local_58;
  pair<long,_long> local_50;
  int local_3c;
  pair<int,_int> local_38;
  pair<long,_long> local_30;
  int local_1c;
  int local_18;
  int local_14;
  
  local_14 = in_ESI;
  bVar1 = std::optional::operator_cast_to_bool((optional<int> *)0x18ac8f);
  if (bVar1) {
    pIVar3 = std::
             unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>::
             operator->((unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                         *)0x18aca2);
    std::operator<<((ostream *)&pIVar3->field_0x50,"* objective\n");
    for (local_1c = 0; local_1c < local_14; local_1c = local_1c + 1) {
      pIVar3 = std::
               unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
               ::operator->((unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                             *)0x18ace2);
      __k = (key_type *)std::operator<<((ostream *)&pIVar3->field_0x50," 1 x");
      std::unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>::
      operator->((unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                  *)0x18ad08);
      std::pair<int,_int>::pair<int_&,_int_&,_true>(&local_38,&local_1c,&local_18);
      std::pair<long,_long>::pair<int,_int,_true>(&local_30,&local_38);
      pmVar5 = std::
               map<std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](in_RDI,__k);
      poVar4 = std::operator<<((ostream *)__k,(string *)pmVar5);
      std::operator<<(poVar4," ");
    }
    pIVar3 = std::
             unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>::
             operator->((unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                         *)0x18ad93);
    poVar4 = std::operator<<((ostream *)&pIVar3->field_0x50,">= ");
    piVar2 = std::optional<int>::operator*((optional<int> *)0x18adbc);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,*piVar2);
    std::operator<<(poVar4," ;\n");
    pIVar3 = std::
             unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>::
             operator->((unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                         *)0x18ade1);
    lVar6 = pIVar3->nb_constraints + 1;
    pIVar3->nb_constraints = lVar6;
    pIVar3 = std::
             unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>::
             operator->((unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                         *)0x18ae02);
    pIVar3->objective_line = lVar6;
  }
  else {
    pIVar3 = std::
             unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>::
             operator->((unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                         *)0x18ae1d);
    std::operator<<((ostream *)&pIVar3->field_0x1d8,"min:");
    for (local_3c = 0; local_3c < local_14; local_3c = local_3c + 1) {
      pIVar3 = std::
               unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
               ::operator->((unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                             *)0x18ae60);
      poVar4 = std::operator<<((ostream *)&pIVar3->field_0x1d8," 1 x");
      std::unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>::
      operator->((unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                  *)0x18ae89);
      std::pair<int,_int>::pair<int_&,_int_&,_true>(&local_58,&local_3c,&local_18);
      std::pair<long,_long>::pair<int,_int,_true>(&local_50,&local_58);
      pmVar5 = std::
               map<std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](in_RDI,in_stack_ffffffffffffff78);
      poVar4 = std::operator<<(poVar4,(string *)pmVar5);
      std::operator<<(poVar4," ");
    }
    pIVar3 = std::
             unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>::
             operator->((unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                         *)0x18af08);
    std::operator<<((ostream *)&pIVar3->field_0x1d8," ;\n");
    for (local_5c = 0; local_5c < local_14; local_5c = local_5c + 1) {
      pIVar3 = std::
               unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
               ::operator->((unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                             *)0x18af45);
      poVar4 = std::operator<<((ostream *)&pIVar3->field_0x558," 1 x");
      std::unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>::
      operator->((unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                  *)0x18af6e);
      std::pair<int,_int>::pair<int_&,_int_&,_true>(&local_78,&local_5c,&local_18);
      std::pair<long,_long>::pair<int,_int,_true>(&local_70,&local_78);
      pmVar5 = std::
               map<std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](in_RDI,in_stack_ffffffffffffff78);
      poVar4 = std::operator<<(poVar4,(string *)pmVar5);
      std::operator<<(poVar4," ");
    }
  }
  return;
}

Assistant:

auto Proof::create_null_decision_bound(int p, int t, optional<int> d) -> void
{
    if (d) {
        _imp->model_stream << "* objective\n";
        for (int v = 0; v < p; ++v)
            _imp->model_stream << " 1 x" << _imp->variable_mappings[pair{v, t}] << " ";
        _imp->model_stream << ">= " << *d << " ;\n";
        _imp->objective_line = ++_imp->nb_constraints;
    }
    else {
        _imp->model_prelude_stream << "min:";
        for (int v = 0; v < p; ++v)
            _imp->model_prelude_stream << " 1 x" << _imp->variable_mappings[pair{v, t}] << " ";
        _imp->model_prelude_stream << " ;\n";

        for (int v = 0; v < p; ++v)
            _imp->objective_sum << " 1 x" << _imp->variable_mappings[pair{v, t}] << " ";
    }
}